

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monkey.c
# Opt level: O3

void mk_server_info(mk_server *server)

{
  mk_list *pmVar1;
  __pid_t _Var2;
  int iVar3;
  char tmp [64];
  char acStack_68 [72];
  
  _Var2 = getpid();
  printf("\x1b[1m[\x1b[92m+\x1b[0m\x1b[1m] \x1b[0mProcess ID is %ld\n",(long)_Var2);
  for (pmVar1 = (server->listeners).next; pmVar1 != &server->listeners; pmVar1 = pmVar1->next) {
    printf("\x1b[1m[\x1b[92m+\x1b[0m\x1b[1m] \x1b[0mServer listening on %s:%s\n",pmVar1[-2].next,
           pmVar1[-1].prev);
  }
  printf("\x1b[1m[\x1b[92m+\x1b[0m\x1b[1m] \x1b[0m%i threads, may handle up to %i client connections\n"
         ,(ulong)(uint)(int)server->workers,(ulong)server->server_capacity);
  printf("\x1b[1m[\x1b[92m+\x1b[0m\x1b[1m] \x1b[0mLoaded Plugins: ");
  for (pmVar1 = (server->plugins).next; pmVar1 != &server->plugins; pmVar1 = pmVar1->next) {
    printf("%s ",pmVar1[-7].prev);
  }
  putchar(10);
  iVar3 = mk_kernel_features_print(acStack_68,0x40,server);
  if (0 < iVar3) {
    printf("\x1b[1m[\x1b[92m+\x1b[0m\x1b[1m] \x1b[0mLinux Features: %s\n",acStack_68);
  }
  fflush(_stdout);
  return;
}

Assistant:

void mk_server_info(struct mk_server *server)
{
    struct mk_list *head;
    struct mk_plugin *p;
    struct mk_config_listener *l;

#ifdef _WIN32
    printf(MK_BANNER_ENTRY "Process ID is %ld\n", (long)GetCurrentProcessId());
#else
    printf(MK_BANNER_ENTRY "Process ID is %ld\n", (long) getpid());
#endif
    mk_list_foreach(head, &server->listeners) {
        l = mk_list_entry(head, struct mk_config_listener, _head);
        printf(MK_BANNER_ENTRY "Server listening on %s:%s\n",
               l->address, l->port);
    }
    printf(MK_BANNER_ENTRY
           "%i threads, may handle up to %i client connections\n",
           server->workers, server->server_capacity);

    /* List loaded plugins */
    printf(MK_BANNER_ENTRY "Loaded Plugins: ");
    mk_list_foreach(head, &server->plugins) {
        p = mk_list_entry(head, struct mk_plugin, _head);
        printf("%s ", p->shortname);
    }
    printf("\n");

#ifdef __linux__
    char tmp[64];

    if (mk_kernel_features_print(tmp, sizeof(tmp), server) > 0) {
        printf(MK_BANNER_ENTRY "Linux Features: %s\n", tmp);
    }
#endif

    fflush(stdout);
}